

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O2

bool Potassco::match(char **input,int *out)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  char *eptr;
  
  lVar2 = strtol(*input,&eptr,10);
  pcVar1 = *input;
  bVar3 = (int)lVar2 == lVar2;
  if (bVar3 && eptr != pcVar1) {
    *out = (int)lVar2;
    *input = eptr;
  }
  return bVar3 && eptr != pcVar1;
}

Assistant:

bool match(const char*& input, int& out) {
	char* eptr;
	long t = std::strtol(input, &eptr, 10);
	if (eptr == input || t < INT_MIN || t > INT_MAX) {
		return false;
	}
	out = static_cast<int>(t);
	input = eptr;
	return true;
}